

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameWalkTrigger(Walker *pWalker,Trigger *pTrigger)

{
  int iVar1;
  long in_RSI;
  SrcList *pFrom;
  int i;
  Upsert *pUpsert;
  TriggerStep *pStep;
  Expr *in_stack_ffffffffffffffc8;
  Select *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  long local_18;
  
  sqlite3WalkExpr((Walker *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  for (local_18 = *(long *)(in_RSI + 0x38); local_18 != 0; local_18 = *(long *)(local_18 + 0x50)) {
    sqlite3WalkSelect((Walker *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0);
    sqlite3WalkExpr((Walker *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    sqlite3WalkExprList((Walker *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (ExprList *)in_stack_ffffffffffffffd0);
    if (*(long *)(local_18 + 0x40) != 0) {
      sqlite3WalkExprList((Walker *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          (ExprList *)in_stack_ffffffffffffffd0);
      sqlite3WalkExprList((Walker *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          (ExprList *)in_stack_ffffffffffffffd0);
      sqlite3WalkExpr((Walker *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      sqlite3WalkExpr((Walker *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    if (*(long *)(local_18 + 0x20) != 0) {
      in_stack_ffffffffffffffd0 = *(Select **)(local_18 + 0x20);
      for (in_stack_ffffffffffffffdc = 0; iVar1._0_1_ = in_stack_ffffffffffffffd0->op,
          iVar1._1_1_ = in_stack_ffffffffffffffd0->field_0x1,
          iVar1._2_2_ = in_stack_ffffffffffffffd0->nSelectRow, in_stack_ffffffffffffffdc < iVar1;
          in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
        if ((*(ushort *)
              ((long)in_stack_ffffffffffffffd0->addrOpenEphm +
              (long)in_stack_ffffffffffffffdc * 0x48 + 0xd) >> 2 & 1) != 0) {
          sqlite3WalkSelect((Walker *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                            in_stack_ffffffffffffffd0);
        }
      }
    }
  }
  return;
}

Assistant:

static void renameWalkTrigger(Walker *pWalker, Trigger *pTrigger){
  TriggerStep *pStep;

  /* Find tokens to edit in WHEN clause */
  sqlite3WalkExpr(pWalker, pTrigger->pWhen);

  /* Find tokens to edit in trigger steps */
  for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
    sqlite3WalkSelect(pWalker, pStep->pSelect);
    sqlite3WalkExpr(pWalker, pStep->pWhere);
    sqlite3WalkExprList(pWalker, pStep->pExprList);
    if( pStep->pUpsert ){
      Upsert *pUpsert = pStep->pUpsert;
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertTarget);
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertSet);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertWhere);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertTargetWhere);
    }
    if( pStep->pFrom ){
      int i;
      SrcList *pFrom = pStep->pFrom;
      for(i=0; i<pFrom->nSrc; i++){
        if( pFrom->a[i].fg.isSubquery ){
          assert( pFrom->a[i].u4.pSubq!=0 );
          sqlite3WalkSelect(pWalker, pFrom->a[i].u4.pSubq->pSelect);
        }
      }
    }
  }
}